

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O0

int lws_hpack_dynamic_size(lws *wsi,int size)

{
  lws_h2_netconn *plVar1;
  bool bVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  undefined2 uVar5;
  lws *wsi_00;
  hpack_dynamic_table *dyn_00;
  hpack_dt_entry *phVar6;
  hpack_dt_entry *phVar7;
  hpack_dt_entry *phVar8;
  int local_44;
  int local_40;
  int m;
  int n;
  int min;
  lws *nwsi;
  hpack_dt_entry *dte;
  hpack_dynamic_table *dyn;
  int size_local;
  lws *wsi_local;
  
  wsi_00 = lws_get_network_wsi(wsi);
  dyn._4_4_ = size;
  if ((wsi_00->h2).h2n != (lws_h2_netconn *)0x0) {
    plVar1 = (wsi_00->h2).h2n;
    dyn_00 = &plVar1->hpack_dyn_table;
    _lws_log(8,"%s: from %d to %d, lim %u\n","lws_hpack_dynamic_size",
             (ulong)(plVar1->hpack_dyn_table).num_entries,(ulong)(uint)size,
             (ulong)(wsi_00->vhost->h2).set.s[1]);
    if (size == 0) {
      dyn._4_4_ = (uint)(plVar1->hpack_dyn_table).num_entries << 3;
      lws_hpack_destroy_dynamic_header(wsi);
    }
    if ((int)(wsi_00->vhost->h2).set.s[1] < (int)dyn._4_4_) {
      _lws_log(8,"rejecting hpack dyn size %u vs %u\n",(ulong)dyn._4_4_,
               (ulong)(wsi_00->vhost->h2).set.s[1]);
      if (((wsi_00->vhost->h2).set.s[1] == 0x10000) && (dyn._4_4_ == 0x10001)) {
        lws_h2_goaway(wsi_00,9,"Asked for header table bigger than we told");
        goto LAB_001458ab;
      }
      dyn._4_4_ = (wsi_00->vhost->h2).set.s[1];
    }
    (plVar1->hpack_dyn_table).virtual_payload_max = dyn._4_4_;
    dyn._4_4_ = (int)dyn._4_4_ / 8;
    m = dyn._4_4_;
    if ((int)(uint)(plVar1->hpack_dyn_table).used_entries < (int)dyn._4_4_) {
      m = (int)(plVar1->hpack_dyn_table).used_entries;
    }
    if (dyn._4_4_ == (plVar1->hpack_dyn_table).num_entries) {
      return 0;
    }
    if ((int)(uint)(plVar1->hpack_dyn_table).num_entries < m) {
      m = (int)(plVar1->hpack_dyn_table).num_entries;
    }
    phVar6 = (hpack_dt_entry *)lws_zalloc((long)(int)(dyn._4_4_ + 1) << 4,"dynamic table entries");
    if (phVar6 != (hpack_dt_entry *)0x0) {
      while( true ) {
        bVar2 = false;
        if (((plVar1->hpack_dyn_table).virtual_payload_usage != 0) &&
           (bVar2 = false, (plVar1->hpack_dyn_table).used_entries != 0)) {
          bVar2 = (plVar1->hpack_dyn_table).virtual_payload_max <
                  (plVar1->hpack_dyn_table).virtual_payload_usage;
        }
        if (!bVar2) break;
        local_40 = (int)((uint)(plVar1->hpack_dyn_table).pos -
                        (uint)(plVar1->hpack_dyn_table).used_entries) %
                   (int)(uint)(plVar1->hpack_dyn_table).num_entries;
        if (local_40 < 0) {
          local_40 = (uint)(plVar1->hpack_dyn_table).num_entries + local_40;
        }
        lws_dynamic_free(dyn_00,local_40);
      }
      if ((int)(uint)(plVar1->hpack_dyn_table).used_entries < m) {
        m = (int)(plVar1->hpack_dyn_table).used_entries;
      }
      if (dyn_00->entries != (hpack_dt_entry *)0x0) {
        for (local_40 = 0; local_40 < m; local_40 = local_40 + 1) {
          local_44 = (int)(((uint)(plVar1->hpack_dyn_table).pos -
                           (uint)(plVar1->hpack_dyn_table).used_entries) + local_40) %
                     (int)(uint)(plVar1->hpack_dyn_table).num_entries;
          if (local_44 < 0) {
            local_44 = (uint)(plVar1->hpack_dyn_table).num_entries + local_44;
          }
          phVar7 = phVar6 + local_40;
          phVar8 = dyn_00->entries + local_44;
          phVar7->value = phVar8->value;
          uVar3 = phVar8->hdr_len;
          uVar4 = phVar8->lws_hdr_idx;
          uVar5 = *(undefined2 *)&phVar8->field_0xe;
          phVar7->value_len = phVar8->value_len;
          phVar7->hdr_len = uVar3;
          phVar7->lws_hdr_idx = uVar4;
          *(undefined2 *)&phVar7->field_0xe = uVar5;
        }
        lws_realloc(dyn_00->entries,0,"lws_free");
      }
      dyn_00->entries = phVar6;
      (plVar1->hpack_dyn_table).num_entries = (uint16_t)dyn._4_4_;
      (plVar1->hpack_dyn_table).used_entries = (uint16_t)m;
      if (dyn._4_4_ == 0) {
        (plVar1->hpack_dyn_table).pos = 0;
      }
      else {
        (plVar1->hpack_dyn_table).pos = (uint16_t)(m % (int)dyn._4_4_);
      }
      lws_h2_dynamic_table_dump(wsi);
      return 0;
    }
  }
LAB_001458ab:
  _lws_log(8,"%s: failed to resize to %d\n","lws_hpack_dynamic_size",(ulong)dyn._4_4_);
  return 1;
}

Assistant:

int
lws_hpack_dynamic_size(struct lws *wsi, int size)
{
	struct hpack_dynamic_table *dyn;
	struct hpack_dt_entry *dte;
	struct lws *nwsi;
	int min, n = 0, m;

	/*
	 * "size" here is coming from the http/2 SETTING
	 * SETTINGS_HEADER_TABLE_SIZE.  This is a (virtual, in our case)
	 * linear buffer containing dynamic header names and values... when it
	 * is full, old entries are evicted.
	 *
	 * We encode the header as an lws_hdr_idx, which is all the rest of
	 * lws cares about; if there is no matching header we store an empty
	 * entry in the dyn table as a placeholder.
	 *
	 * So to make the two systems work together we keep an accounting of
	 * what we are using to decide when to evict... we must only evict
	 * things when the remote peer's accounting also makes him feel he
	 * should evict something.
	 */

	nwsi = lws_get_network_wsi(wsi);
	if (!nwsi->h2.h2n)
		goto bail;

	dyn = &nwsi->h2.h2n->hpack_dyn_table;
	lwsl_info("%s: from %d to %d, lim %u\n", __func__,
		  (int)dyn->num_entries, size,
		  (unsigned int)nwsi->vhost->h2.set.s[H2SET_HEADER_TABLE_SIZE]);

	if (!size) {
		size = dyn->num_entries * 8;
		lws_hpack_destroy_dynamic_header(wsi);
	}

	if (size > (int)nwsi->vhost->h2.set.s[H2SET_HEADER_TABLE_SIZE]) {
		lwsl_info("rejecting hpack dyn size %u vs %u\n", size,
			  (unsigned int)nwsi->vhost->h2.set.s[H2SET_HEADER_TABLE_SIZE]);

		// this seems necessary to work with some browsers

		if (nwsi->vhost->h2.set.s[H2SET_HEADER_TABLE_SIZE] == 65536 &&
				size == 65537) { /* h2spec */
			lws_h2_goaway(nwsi, H2_ERR_COMPRESSION_ERROR,
				  "Asked for header table bigger than we told");
			goto bail;
		}

		size = nwsi->vhost->h2.set.s[H2SET_HEADER_TABLE_SIZE];
	}

	dyn->virtual_payload_max = size;

	size = size / 8;
	min = size;
	if (min > dyn->used_entries)
		min = dyn->used_entries;

	if (size == dyn->num_entries)
		return 0;

	if (dyn->num_entries < min)
		min = dyn->num_entries;

	// lwsl_notice("dte requested size %d\n", size);

	dte = lws_zalloc(sizeof(*dte) * (size + 1), "dynamic table entries");
	if (!dte)
		goto bail;

	while (dyn->virtual_payload_usage && dyn->used_entries &&
	       dyn->virtual_payload_usage > dyn->virtual_payload_max) {
		n = (dyn->pos - dyn->used_entries) % dyn->num_entries;
		if (n < 0)
			n += dyn->num_entries;
		lws_dynamic_free(dyn, n);
	}

	if (min > dyn->used_entries)
		min = dyn->used_entries;

	if (dyn->entries) {
		for (n = 0; n < min; n++) {
			m = (dyn->pos - dyn->used_entries + n) %
						dyn->num_entries;
			if (m < 0)
				m += dyn->num_entries;
			dte[n] = dyn->entries[m];
		}

		lws_free(dyn->entries);
	}

	dyn->entries = dte;
	dyn->num_entries = size;
	dyn->used_entries = min;
	if (size)
		dyn->pos = min % size;
	else
		dyn->pos = 0;

	lws_h2_dynamic_table_dump(wsi);

	return 0;

bail:
	lwsl_info("%s: failed to resize to %d\n", __func__, size);

	return 1;
}